

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createSCmpGE(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  BinaryInstr<(flow::BinaryOperator)25,_(flow::LiteralType)1> *pBVar6;
  string local_80;
  Value *local_60;
  Value *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_60 = rhs;
  local_58 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x1b7,
                  "Value *flow::IRBuilder::createSCmpGE(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ != String) {
    __assert_fail("lhs->type() == LiteralType::String",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x1b8,
                  "Value *flow::IRBuilder::createSCmpGE(Value *, Value *, const std::string &)");
  }
  lVar3 = __dynamic_cast(lhs,&Value::typeinfo,
                         &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  if ((lVar3 == 0) ||
     (lVar4 = __dynamic_cast(rhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0),
     lVar4 == 0)) {
    makeName(&local_80,this,name);
    pBVar6 = insert<flow::BinaryInstr<(flow::BinaryOperator)25,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                       (this,&local_58,&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return (Value *)pBVar6;
    }
    goto LAB_0014144e;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,*(long *)(lVar3 + 0x48),
             *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)(lVar4 + 0x48),
             *(long *)(lVar4 + 0x50) + *(long *)(lVar4 + 0x48));
  plVar1 = local_50;
  uVar5 = local_80._M_string_length;
  if (local_48 < local_80._M_string_length) {
    uVar5 = local_48;
  }
  if (uVar5 == 0) {
LAB_001413bf:
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_80._M_string_length - local_48)) {
      uVar5 = local_80._M_string_length - local_48;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0x7fffffff;
    }
  }
  else {
    uVar2 = memcmp(local_80._M_dataplus._M_p,local_50,uVar5);
    uVar5 = (ulong)uVar2;
    if (uVar2 == 0) goto LAB_001413bf;
  }
  lVar3 = 0x68;
  if (-1 < (int)uVar5) {
    lVar3 = 0x18;
  }
  pBVar6 = (BinaryInstr<(flow::BinaryOperator)25,_(flow::LiteralType)1> *)
           ((long)&(this->program_->modules_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar3);
  if (plVar1 != local_40) {
    operator_delete(plVar1,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    return (Value *)pBVar6;
  }
LAB_0014144e:
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  return (Value *)pBVar6;
}

Assistant:

Value* IRBuilder::createSCmpGE(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() >= b->get());

  return insert<SCmpGEInstr>(lhs, rhs, makeName(name));
}